

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

int lws_mqtt_set_client_established(lws *wsi)

{
  int iVar1;
  int iVar2;
  
  lws_role_transition(wsi,0x10000000,LRS_ESTABLISHED,&role_ops_mqtt);
  iVar2 = 0;
  iVar1 = user_callback_handle_rxflow
                    (wsi->protocol->callback,wsi,LWS_CALLBACK_MQTT_CLIENT_ESTABLISHED,
                     wsi->user_space,(void *)0x0,0);
  if (iVar1 < 0) {
    _lws_log(1,"%s: MQTT_ESTABLISHED failed\n","lws_mqtt_set_client_established");
    iVar2 = -1;
  }
  else {
    lws_validity_confirmed(wsi);
    lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
  }
  return iVar2;
}

Assistant:

static int
lws_mqtt_set_client_established(struct lws *wsi)
{
	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_ESTABLISHED,
			    &role_ops_mqtt);

	if (user_callback_handle_rxflow(wsi->protocol->callback,
					wsi, LWS_CALLBACK_MQTT_CLIENT_ESTABLISHED,
					wsi->user_space, NULL, 0) < 0) {
		lwsl_err("%s: MQTT_ESTABLISHED failed\n", __func__);

		return -1;
	}
	/*
	 * If we made a new connection and got the ACK, our connection is
	 * definitely working in both directions at the moment
	 */
	lws_validity_confirmed(wsi);

	/* clear connection timeout */
	lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

	return 0;
}